

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_ssize_t
utf8proc_decompose(utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_int32_t *buffer,
                  utf8proc_ssize_t bufsize,utf8proc_option_t options)

{
  utf8proc_int32_t uc_00;
  utf8proc_int32_t uc_01;
  utf8proc_ssize_t uVar1;
  utf8proc_property_t *puVar2;
  utf8proc_property_t *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  utf8proc_ssize_t uStack_60;
  utf8proc_int32_t uc;
  utf8proc_int32_t *local_48;
  long local_40;
  utf8proc_option_t local_38;
  int boundclass;
  
  local_38 = options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE);
  if ((options & (UTF8PROC_STRIPMARK|UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) == UTF8PROC_STRIPMARK ||
      local_38 == (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) {
    uStack_60 = -5;
  }
  else {
    boundclass = 0;
    lVar5 = 0;
    lVar6 = 0;
    local_48 = (utf8proc_int32_t *)bufsize;
    local_40 = strlen;
    do {
      if ((options & UTF8PROC_NULLTERM) == 0) {
        if (local_40 - lVar5 == 0 || local_40 < lVar5) {
LAB_0013d1f3:
          if (local_38 == 0) {
            return lVar6;
          }
          if (lVar6 <= (long)local_48) {
            local_40 = lVar6 + -1;
            lVar5 = 0;
            local_48 = buffer;
            while (lVar4 = lVar5, lVar4 < local_40) {
              uc_00 = local_48[lVar4];
              uc_01 = local_48[lVar4 + 1];
              lVar5 = lVar4 + 1;
              puVar2 = unsafe_get_property(uc_00);
              puVar3 = unsafe_get_property(uc_01);
              if ((puVar3->combining_class < puVar2->combining_class) &&
                 (0 < puVar3->combining_class)) {
                local_48[lVar4] = uc_01;
                local_48[lVar4 + 1] = uc_00;
                if (0 < lVar4) {
                  lVar5 = lVar4 + -1;
                }
              }
            }
            return lVar6;
          }
          return lVar6;
        }
        uVar1 = utf8proc_iterate(str + lVar5,local_40 - lVar5,&uc);
        if (uc < 0) {
          return -3;
        }
        lVar5 = uVar1 + lVar5;
      }
      else {
        uVar1 = utf8proc_iterate(str + lVar5,-1,&uc);
        if (uc < 0) {
          return -3;
        }
        lVar5 = uVar1 + lVar5;
        if (lVar5 < 0) break;
        if (uc == 0) goto LAB_0013d1f3;
      }
      uVar1 = (long)local_48 - lVar6;
      if (uVar1 == 0 || (long)local_48 < lVar6) {
        uVar1 = 0;
      }
      uVar1 = utf8proc_decompose_char(uc,buffer + lVar6,uVar1,options,&boundclass);
      if (uVar1 < 0) {
        return uVar1;
      }
      lVar6 = lVar6 + uVar1;
    } while (lVar6 < 0x1000000000000000);
    uStack_60 = -2;
  }
  return uStack_60;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen,
  utf8proc_int32_t *buffer, utf8proc_ssize_t bufsize, utf8proc_option_t options
) {
  /* strlen will be ignored, if UTF8PROC_NULLTERM is set in options */
  utf8proc_ssize_t wpos = 0;
  if ((options & UTF8PROC_COMPOSE) && (options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  if ((options & UTF8PROC_STRIPMARK) &&
      !(options & UTF8PROC_COMPOSE) && !(options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  {
    utf8proc_int32_t uc;
    utf8proc_ssize_t rpos = 0;
    utf8proc_ssize_t decomp_result;
    int boundclass = UTF8PROC_BOUNDCLASS_START;
    while (1) {
      if (options & UTF8PROC_NULLTERM) {
        rpos += utf8proc_iterate(str + rpos, -1, &uc);
        /* checking of return value is not necessary,
           as 'uc' is < 0 in case of error */
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
        if (rpos < 0) return UTF8PROC_ERROR_OVERFLOW;
        if (uc == 0) break;
      } else {
        if (rpos >= strlen) break;
        rpos += utf8proc_iterate(str + rpos, strlen - rpos, &uc);
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
      }
      decomp_result = utf8proc_decompose_char(
        uc, buffer + wpos, (bufsize > wpos) ? (bufsize - wpos) : 0, options,
        &boundclass
      );
      if (decomp_result < 0) return decomp_result;
      wpos += decomp_result;
      /* prohibiting integer overflows due to too long strings: */
      if (wpos < 0 ||
          wpos > (utf8proc_ssize_t)(SSIZE_MAX/sizeof(utf8proc_int32_t)/2))
        return UTF8PROC_ERROR_OVERFLOW;
    }
  }
  if ((options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) && bufsize >= wpos) {
    utf8proc_ssize_t pos = 0;
    while (pos < wpos-1) {
      utf8proc_int32_t uc1, uc2;
      const utf8proc_property_t *property1, *property2;
      uc1 = buffer[pos];
      uc2 = buffer[pos+1];
      property1 = unsafe_get_property(uc1);
      property2 = unsafe_get_property(uc2);
      if (property1->combining_class > property2->combining_class &&
          property2->combining_class > 0) {
        buffer[pos] = uc2;
        buffer[pos+1] = uc1;
        if (pos > 0) pos--; else pos++;
      } else {
        pos++;
      }
    }
  }
  return wpos;
}